

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

short __thiscall
duckdb::Interpolator<false>::Interpolate<unsigned_long,short,duckdb::QuantileIndirect<short>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<short> *accessor)

{
  DataChunk *pDVar1;
  short sVar2;
  CURSOR *pCVar3;
  bool bVar4;
  bool bVar5;
  reference pvVar6;
  int iVar7;
  unkbyte10 Var8;
  short result_1;
  short local_52;
  string local_50;
  
  pCVar3 = accessor->data;
  bVar4 = (pCVar3->scan).next_row_index <= lidx;
  bVar5 = lidx < (pCVar3->scan).current_row_index;
  if (lidx == hidx) {
    if (bVar5 || bVar4) {
      pDVar1 = &pCVar3->page;
      ColumnDataCollection::Seek(pCVar3->inputs,lidx,&pCVar3->scan,pDVar1);
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar3->data = (short *)pvVar6->data;
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar6);
      pCVar3->validity = &pvVar6->validity;
    }
    sVar2 = pCVar3->data[(uint)((int)lidx - (int)(pCVar3->scan).current_row_index)];
    bVar5 = TryCast::Operation<short,short>(sVar2,&local_52,false);
    if (!bVar5) {
      Var8 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,short>
                (&local_50,(duckdb *)(ulong)(uint)(int)sVar2,(short)((unkuint10)Var8 >> 0x40));
      InvalidInputException::InvalidInputException((InvalidInputException *)Var8,&local_50);
      __cxa_throw((InvalidInputException *)Var8,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
  }
  else {
    if (bVar5 || bVar4) {
      pDVar1 = &pCVar3->page;
      ColumnDataCollection::Seek(pCVar3->inputs,lidx,&pCVar3->scan,pDVar1);
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar3->data = (short *)pvVar6->data;
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar6);
      pCVar3->validity = &pvVar6->validity;
    }
    sVar2 = pCVar3->data[(uint)((int)lidx - (int)(pCVar3->scan).current_row_index)];
    bVar5 = TryCast::Operation<short,short>(sVar2,&local_52,false);
    if (!bVar5) {
      Var8 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,short>
                (&local_50,(duckdb *)(ulong)(uint)(int)sVar2,(short)((unkuint10)Var8 >> 0x40));
      InvalidInputException::InvalidInputException((InvalidInputException *)Var8,&local_50);
      __cxa_throw((InvalidInputException *)Var8,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    iVar7 = (int)local_52;
    pCVar3 = accessor->data;
    if (((pCVar3->scan).next_row_index <= hidx) || (hidx < (pCVar3->scan).current_row_index)) {
      pDVar1 = &pCVar3->page;
      ColumnDataCollection::Seek(pCVar3->inputs,hidx,&pCVar3->scan,pDVar1);
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar3->data = (short *)pvVar6->data;
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar6);
      pCVar3->validity = &pvVar6->validity;
    }
    sVar2 = pCVar3->data[(uint)((int)hidx - (int)(pCVar3->scan).current_row_index)];
    bVar5 = TryCast::Operation<short,short>(sVar2,&local_52,false);
    if (!bVar5) {
      Var8 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,short>
                (&local_50,(duckdb *)(ulong)(uint)(int)sVar2,(short)((unkuint10)Var8 >> 0x40));
      InvalidInputException::InvalidInputException((InvalidInputException *)Var8,&local_50);
      __cxa_throw((InvalidInputException *)Var8,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    local_52 = (short)(int)((double)(local_52 - iVar7) *
                            (this->RN -
                            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                             1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                           (double)iVar7);
  }
  return local_52;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}